

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m2v_add(m2v *A,m2v *B,m2v *out)

{
  undefined8 in_RDX;
  m2v *in_RSI;
  int *in_RDI;
  int i;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < *in_RDI; iVar1 = iVar1 + 1) {
    m2v_copy_row(in_RSI,(int)((ulong)in_RDX >> 0x20),
                 (m2v *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    m2v_multadd_row(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
                    (m2v *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

void MV_GEN_N(_add)(const MV_GEN_TYPE* A, const MV_GEN_TYPE* B, MV_GEN_TYPE* out)
{
	assert(A->n_row == B->n_row);
	assert(A->n_col == B->n_col);
	assert(A->n_row == out->n_row);
	assert(A->n_col == out->n_col);

	for (int i = 0; i < A->n_row; ++i) {
		MV_GEN_N(_copy_row)(A, i, out, i);
		MV_GEN_N(_multadd_row)(B, i, 1, out, i);
	}
}